

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool vkt::tessellation::(anonymous_namespace)::
     contains<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>,tcu::Vector<float,3>>
               (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *c,Vector<float,_3> *key)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  Vector<float,_3> *local_18;
  Vector<float,_3> *key_local;
  set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  *c_local;
  
  local_18 = key;
  key_local = (Vector<float,_3> *)c;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
       ::find(c,key);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
       ::end((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              *)key_local);
  bVar1 = std::operator!=(&local_20,&local_28);
  return bVar1;
}

Assistant:

inline bool contains (const ContainerT& c, const T& key)
{
	return c.find(key) != c.end();
}